

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_client.cc
# Opt level: O3

int main(void)

{
  _Atomic_word *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Base_ptr *pp_Var4;
  int iVar5;
  size_t sVar6;
  Builder<prometheus::Counter> *pBVar7;
  Family<prometheus::Counter> *this;
  Counter *this_00;
  int *piVar8;
  long *plVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_5ca;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_5c9;
  shared_ptr<prometheus::Registry> registry;
  string local_5b8;
  string local_598;
  undefined1 local_578 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_570;
  char local_568 [48];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4f8;
  string local_4b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_498;
  Labels labels;
  Gateway gateway;
  
  iVar5 = gethostname((char *)&gateway,0x400);
  paVar10 = &local_4b8.field_2;
  local_4b8._M_dataplus._M_p = (pointer)paVar10;
  if (iVar5 == 0) {
    sVar6 = strlen((char *)&gateway);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_4b8,&gateway,(long)&gateway.jobUri_._M_dataplus._M_p + sVar6);
  }
  else {
    local_4b8._M_string_length = 0;
    local_4b8.field_2._M_local_buf[0] = '\0';
  }
  prometheus::Gateway::GetInstanceLabel(&labels,&local_4b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != paVar10) {
    operator_delete(local_4b8._M_dataplus._M_p);
  }
  local_578 = (undefined1  [8])local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"127.0.0.1","");
  paVar3 = &local_4f8.first.field_2;
  local_4f8.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"9091","");
  pp_Var4 = &local_498._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_498._M_impl._0_8_ = pp_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_498,"sample_client","");
  paVar10 = &local_5b8.field_2;
  local_5b8._M_string_length = 0;
  local_5b8.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_598.field_2;
  local_598._M_string_length = 0;
  local_598.field_2._M_local_buf[0] = '\0';
  local_5b8._M_dataplus._M_p = (pointer)paVar10;
  local_598._M_dataplus._M_p = (pointer)paVar2;
  prometheus::Gateway::Gateway
            (&gateway,(string *)local_578,&local_4f8.first,(string *)&local_498,&labels,&local_5b8,
             &local_598,(seconds)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != paVar2) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar10) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  if ((_Base_ptr *)local_498._M_impl._0_8_ != pp_Var4) {
    operator_delete((void *)local_498._M_impl._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_4f8.first._M_dataplus._M_p);
  }
  if (local_578 != (undefined1  [8])local_568) {
    operator_delete((void *)local_578);
  }
  registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<prometheus::Registry,std::allocator<prometheus::Registry>>
            (&registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(Registry **)&registry,(allocator<prometheus::Registry> *)local_578);
  prometheus::BuildCounter();
  local_5b8._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5b8,"time_running_seconds_total","");
  pBVar7 = prometheus::detail::Builder<prometheus::Counter>::Name
                     ((Builder<prometheus::Counter> *)local_578,&local_5b8);
  local_598._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_598,"How many seconds is this server running?","");
  pBVar7 = prometheus::detail::Builder<prometheus::Counter>::Help(pBVar7,&local_598);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[6],_true>
            (&local_4f8,(char (*) [6])0x118077,(char (*) [6])"value");
  __l._M_len = 1;
  __l._M_array = &local_4f8;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_498,__l,&local_5c9,&local_5ca);
  pBVar7 = prometheus::detail::Builder<prometheus::Counter>::Labels(pBVar7,(Labels *)&local_498);
  this = prometheus::detail::Builder<prometheus::Counter>::Register
                   (pBVar7,registry.
                           super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.second._M_dataplus._M_p != &local_4f8.second.field_2) {
    operator_delete(local_4f8.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_4f8.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598._M_dataplus._M_p != paVar2) {
    operator_delete(local_598._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != paVar10) {
    operator_delete(local_5b8._M_dataplus._M_p);
  }
  prometheus::detail::Builder<prometheus::Counter>::~Builder
            ((Builder<prometheus::Counter> *)local_578);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[14],_const_char_(&)[6],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_578,(char (*) [14])0x11806f,(char (*) [6])"value");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[18],_const_char_(&)[6],_true>
            (&local_538,(char (*) [18])"yet_another_label",(char (*) [6])"value");
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_578;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&local_4f8,__l_00,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &local_498,(allocator_type *)&local_5b8);
  this_00 = prometheus::Family<prometheus::Counter>::Add<>(this,(Labels *)&local_4f8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_4f8);
  lVar11 = -0x80;
  paVar10 = &local_538.second.field_2;
  do {
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar10->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
    }
    if (paVar10->_M_local_buf + -0x20 != *(char **)(paVar10->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar10->_M_local_buf + -0x30));
    }
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar10->_M_local_buf + -0x40);
    lVar11 = lVar11 + 0x40;
  } while (lVar11 != 0);
  local_578 = (undefined1  [8])
              registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_570._M_pi =
       registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_weak_count =
           (registry.super___shared_ptr<prometheus::Registry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  prometheus::Gateway::RegisterCollectable
            (&gateway,(weak_ptr<prometheus::Collectable> *)local_578,(Labels *)0x0);
  if (local_570._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_570._M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (local_570._M_pi)->_M_weak_count;
      (local_570._M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(local_570._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  local_578 = (undefined1  [8])local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"Foo:foo","");
  prometheus::Gateway::AddHttpHeader(&gateway,(string *)local_578);
  if (local_578 != (undefined1  [8])local_568) {
    operator_delete((void *)local_578);
  }
  do {
    local_578 = (undefined1  [8])0x1;
    local_570._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      iVar5 = nanosleep((timespec *)local_578,(timespec *)local_578);
      if (iVar5 != -1) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    prometheus::Counter::Increment(this_00);
    iVar5 = prometheus::Gateway::Push(&gateway);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"returnCode is ",0xe);
    plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
    std::ostream::put((char)plVar9);
    std::ostream::flush();
  } while( true );
}

Assistant:

int main() {
  using namespace prometheus;

  // create a push gateway
  const auto labels = Gateway::GetInstanceLabel(GetHostName());

  Gateway gateway{"127.0.0.1", "9091", "sample_client", labels};

  // create a metrics registry with component=main labels applied to all its
  // metrics
  auto registry = std::make_shared<Registry>();

  // add a new counter family to the registry (families combine values with the
  // same name, but distinct label dimensions)
  auto& counter_family = BuildCounter()
                             .Name("time_running_seconds_total")
                             .Help("How many seconds is this server running?")
                             .Labels({{"label", "value"}})
                             .Register(*registry);

  // add a counter to the metric family
  auto& second_counter = counter_family.Add(
      {{"another_label", "value"}, {"yet_another_label", "value"}});

  // ask the pusher to push the metrics to the pushgateway
  gateway.RegisterCollectable(registry);

  // add custom HTTP header
  gateway.AddHttpHeader("Foo:foo");

  for (;;) {
    std::this_thread::sleep_for(std::chrono::seconds(1));
    // increment the counter by one (second)
    second_counter.Increment();

    // push metrics
    auto returnCode = gateway.Push();
    std::cout << "returnCode is " << returnCode << std::endl;
  }
  return 0;
}